

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impute.hpp
# Opt level: O2

void build_impute_node<InputData<float,long>&,WorkerMemory<ImputedData<long,long_double>,long_double,float>&,long_double>
               (ImputeNode *imputer,
               WorkerMemory<ImputedData<long,_long_double>,_long_double,_float> *workspace,
               InputData<float,_long> *input_data,ModelParams *model_params,
               vector<ImputeNode,_std::allocator<ImputeNode>_> *imputer_tree,size_t curr_depth,
               size_t min_imp_obs)

{
  vector<double,_std::allocator<double>_> *this;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *this_00;
  vector<double,_std::allocator<double>_> *this_01;
  WeighImpRows WVar1;
  pointer puVar2;
  pointer pdVar3;
  pointer pIVar4;
  double *pdVar5;
  pointer pdVar6;
  float *pfVar7;
  long lVar8;
  bool bVar9;
  bool bVar10;
  uint uVar11;
  pointer pdVar12;
  unsigned_long *key;
  long *plVar13;
  uchar *puVar14;
  int *piVar15;
  size_t col_1;
  ImputeNode *pIVar16;
  double *pdVar17;
  ulong uVar18;
  pointer pvVar19;
  size_t sVar20;
  ulong uVar21;
  ulong uVar22;
  size_t col_5;
  size_t sVar23;
  long lVar24;
  size_t sVar25;
  size_t col;
  ulong uVar26;
  long lVar27;
  longdouble in_ST0;
  longdouble lVar28;
  longdouble lVar29;
  longdouble lVar30;
  double dVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  float fVar35;
  undefined1 in_XMM2 [16];
  undefined1 auVar36 [16];
  double dVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  double dVar41;
  pair<tsl::detail_robin_hash::robin_hash<std::pair<unsigned_long,_double>,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::robin_iterator<false>,_bool>
  pVar42;
  robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
  *in_stack_ffffffffffffff08;
  vector<double,_std::allocator<double>_> *__range3;
  size_t ix;
  vector<double,_std::allocator<double>_> *__range3_1;
  longdouble local_a8;
  double __tmp;
  double dStack_90;
  float local_7c;
  size_t local_78;
  vector<ImputeNode,_std::allocator<ImputeNode>_> *local_70;
  ModelParams *local_68;
  robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
  *local_60;
  double local_58;
  double local_50;
  double local_48;
  long local_40;
  double local_38;
  
  bVar9 = (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start;
  bVar10 = (workspace->weights_map).m_ht.m_nb_elements == 0;
  local_78 = curr_depth;
  local_70 = imputer_tree;
  local_68 = model_params;
  if (bVar9 && bVar10) {
    lVar24 = (workspace->end - workspace->st) + 1;
    auVar32._8_4_ = (int)((ulong)lVar24 >> 0x20);
    auVar32._0_8_ = lVar24;
    auVar32._12_4_ = 0x45300000;
    dStack_90 = auVar32._8_8_ - 1.9342813113834067e+25;
    __tmp = dStack_90 + ((double)CONCAT44(0x43300000,(int)lVar24) - 4503599627370496.0);
  }
  else {
    calculate_sum_weights<long_double>
              ((longdouble *)workspace,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)workspace->st,workspace->end
               ,curr_depth,(size_t)&workspace->weights_arr,
               (vector<double,_std::allocator<double>_> *)&workspace->weights_map,
               in_stack_ffffffffffffff08);
    __tmp = (double)in_ST0;
    dStack_90 = 0.0;
    local_38 = __tmp;
  }
  ix = 0;
  std::vector<double,_std::allocator<double>_>::resize
            (&imputer->num_sum,input_data->ncols_numeric,(value_type_conflict *)&ix);
  this = &imputer->num_weight;
  ix = 0;
  std::vector<double,_std::allocator<double>_>::resize
            (this,input_data->ncols_numeric,(value_type_conflict *)&ix);
  this_00 = &imputer->cat_sum;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize(this_00,input_data->ncols_categ);
  this_01 = &imputer->cat_weight;
  ix = 0;
  std::vector<double,_std::allocator<double>_>::resize
            (this_01,input_data->ncols_categ,(value_type_conflict *)&ix);
  std::vector<double,_std::allocator<double>_>::_M_shrink_to_fit(&imputer->num_sum);
  std::vector<double,_std::allocator<double>_>::_M_shrink_to_fit(this);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::_M_shrink_to_fit(this_00);
  __range3_1 = this_01;
  std::vector<double,_std::allocator<double>_>::_M_shrink_to_fit(this_01);
  lVar24 = 0;
  for (uVar26 = 0; uVar18 = input_data->ncols_categ, uVar26 < uVar18; uVar26 = uVar26 + 1) {
    std::vector<double,_std::allocator<double>_>::resize
              ((vector<double,_std::allocator<double>_> *)
               ((long)&(((this_00->
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data + lVar24),(long)input_data->ncat[uVar26]);
    std::vector<double,_std::allocator<double>_>::_M_shrink_to_fit
              ((vector<double,_std::allocator<double>_> *)
               ((long)&(((this_00->
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data + lVar24));
    lVar24 = lVar24 + 0x18;
  }
  uVar26 = input_data->ncols_numeric;
  if ((uVar18 != 0) || (input_data->Xc_indptr == (long *)0x0 && uVar26 != 0)) {
    pfVar7 = input_data->numeric_data;
    if (bVar9 && bVar10) {
      if (pfVar7 != (float *)0x0) {
        sVar25 = workspace->st;
        uVar21 = workspace->end;
        pdVar12 = (this->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        local_a8 = (longdouble)CONCAT28(local_a8._8_2_,pdVar12);
        for (uVar22 = 0; uVar22 != uVar26; uVar22 = uVar22 + 1) {
          puVar2 = (workspace->ix_arr).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          sVar20 = input_data->nrows;
          pdVar3 = (imputer->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar24 = 0;
          for (sVar23 = sVar25; sVar23 <= uVar21; sVar23 = sVar23 + 1) {
            dVar31 = (double)pfVar7[sVar20 * uVar22 + puVar2[sVar23]];
            if (ABS(dVar31) != INFINITY && !NAN(pfVar7[sVar20 * uVar22 + puVar2[sVar23]])) {
              lVar24 = lVar24 + 1;
              local_48 = pdVar3[uVar22];
              local_50 = dVar31 - local_48;
              pdVar3[uVar22] =
                   (double)((float)local_50 / ((float)lVar24 + (float)(&DAT_003250d8)[lVar24 < 0]) +
                           (float)local_48);
              local_40 = lVar24;
            }
          }
          auVar36._8_4_ = (int)((ulong)lVar24 >> 0x20);
          auVar36._0_8_ = lVar24;
          auVar36._12_4_ = 0x45300000;
          pdVar12[uVar22] =
               (auVar36._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar24) - 4503599627370496.0);
        }
      }
      piVar15 = input_data->categ_data;
      if (piVar15 != (int *)0x0) {
        sVar25 = workspace->st;
        uVar26 = workspace->end;
        pdVar12 = (__range3_1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        for (uVar21 = 0; uVar21 != uVar18; uVar21 = uVar21 + 1) {
          puVar2 = (workspace->ix_arr).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          sVar20 = input_data->nrows;
          pvVar19 = (this_00->
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          lVar24 = 0;
          for (sVar23 = sVar25; sVar23 <= uVar26; sVar23 = sVar23 + 1) {
            lVar27 = (long)piVar15[sVar20 * uVar21 + puVar2[sVar23]];
            if (-1 < lVar27) {
              lVar24 = lVar24 + 1;
              lVar8 = *(long *)&pvVar19[uVar21].super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data;
              *(double *)(lVar8 + lVar27 * 8) = *(double *)(lVar8 + lVar27 * 8) + 1.0;
            }
          }
          auVar39._8_4_ = (int)((ulong)lVar24 >> 0x20);
          auVar39._0_8_ = lVar24;
          auVar39._12_4_ = 0x45300000;
          pdVar12[uVar21] =
               (auVar39._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar24) - 4503599627370496.0);
        }
      }
    }
    else {
      if (pfVar7 != (float *)0x0) {
        for (uVar18 = 0; uVar18 < uVar26; uVar18 = uVar18 + 1) {
          sVar25 = workspace->st;
          lVar24 = sVar25 * 8;
          lVar30 = (longdouble)0;
          lVar29 = lVar30;
          for (; sVar25 <= workspace->end; sVar25 = sVar25 + 1) {
            puVar2 = (workspace->ix_arr).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start;
            lVar27 = *(long *)((long)puVar2 + lVar24);
            in_XMM2._0_8_ = (double)input_data->numeric_data[lVar27 + input_data->nrows * uVar18];
            lVar28 = lVar29;
            if (ABS(in_XMM2._0_8_) != INFINITY &&
                !NAN(input_data->numeric_data[lVar27 + input_data->nrows * uVar18])) {
              pdVar12 = (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if ((workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_finish == pdVar12) {
                local_a8 = lVar30;
                pVar42 = tsl::detail_robin_hash::
                         robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                         ::try_emplace<unsigned_long_const&>
                                   ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                                     *)&workspace->weights_map,
                                    (unsigned_long *)((long)puVar2 + lVar24));
                in_XMM2._8_8_ = 0;
                puVar14 = (pVar42.first.m_bucket.m_bucket)->m_value + 8;
                lVar30 = local_a8;
              }
              else {
                puVar14 = (uchar *)(pdVar12 + lVar27);
              }
              dVar31 = *(double *)puVar14;
              pdVar12 = (this->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start;
              pdVar12[uVar18] = pdVar12[uVar18] + dVar31;
              in_XMM2._0_8_ = in_XMM2._0_8_ * dVar31;
              lVar28 = lVar29 + ((longdouble)in_XMM2._0_8_ - lVar30);
              lVar30 = (lVar28 - lVar29) - ((longdouble)in_XMM2._0_8_ - lVar30);
              local_58 = in_XMM2._0_8_;
            }
            lVar24 = lVar24 + 8;
            lVar29 = lVar28;
          }
          (imputer->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar18] =
               (double)(lVar29 / (longdouble)
                                 (imputer->num_weight).
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_start[uVar18]);
          uVar26 = input_data->ncols_numeric;
        }
        uVar18 = input_data->ncols_categ;
      }
      if (uVar18 != 0) {
        for (uVar26 = workspace->st; uVar26 <= workspace->end; uVar26 = uVar26 + 1) {
          ix = (workspace->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar26];
          pdVar12 = (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          if ((workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish == pdVar12) {
            pVar42 = tsl::detail_robin_hash::
                     robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                     ::try_emplace<unsigned_long_const&>
                               ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                                 *)&workspace->weights_map,&ix);
            puVar14 = (pVar42.first.m_bucket.m_bucket)->m_value + 8;
            uVar18 = input_data->ncols_categ;
          }
          else {
            puVar14 = (uchar *)(pdVar12 + ix);
          }
          dVar31 = *(double *)puVar14;
          sVar25 = input_data->nrows;
          piVar15 = input_data->categ_data + ix;
          pvVar19 = (this_00->
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          pdVar12 = (__range3_1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          for (uVar21 = 0; uVar18 != uVar21; uVar21 = uVar21 + 1) {
            lVar24 = (long)*piVar15;
            if (-1 < lVar24) {
              lVar27 = *(long *)&(pvVar19->super__Vector_base<double,_std::allocator<double>_>).
                                 _M_impl.super__Vector_impl_data;
              *(double *)(lVar27 + lVar24 * 8) = *(double *)(lVar27 + lVar24 * 8) + dVar31;
              pdVar12[uVar21] = pdVar12[uVar21] + dVar31;
            }
            pvVar19 = pvVar19 + 1;
            piVar15 = piVar15 + sVar25;
          }
        }
      }
    }
  }
  if (input_data->Xc_indptr == (long *)0x0) {
LAB_0029cbba:
    auVar33._0_8_ = (double)CONCAT44(0x43300000,(int)min_imp_obs);
    auVar33._8_4_ = (int)(min_imp_obs >> 0x20);
    auVar33._12_4_ = 0x45300000;
    dVar31 = (auVar33._8_8_ - 1.9342813113834067e+25) + (auVar33._0_8_ - 4503599627370496.0);
    pdVar12 = (imputer->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((imputer->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish != pdVar12) {
      sVar25 = input_data->ncols_numeric;
      pdVar3 = (this->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pIVar4 = (local_70->super__Vector_base<ImputeNode,_std::allocator<ImputeNode>_>)._M_impl.
               super__Vector_impl_data._M_start;
      for (sVar20 = 0; sVar20 != sVar25; sVar20 = sVar20 + 1) {
        pdVar17 = pdVar3 + sVar20;
        pIVar16 = imputer;
        lVar24 = 2;
        if (*pdVar17 <= dVar31 && dVar31 != *pdVar17) {
          while( true ) {
            sVar23 = pIVar16->parent;
            pIVar16 = pIVar4 + sVar23;
            dVar37 = *(double *)
                      (*(long *)&pIVar4[sVar23].num_sum.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl +
                      sVar20 * 8);
            if ((ulong)ABS(dVar37) < 0x7ff0000000000000) break;
            if (sVar23 == 0) {
              pdVar12[sVar20] = NAN;
              dVar37 = 0.0;
              goto LAB_0029ccbd;
            }
            lVar24 = lVar24 + 2;
          }
          pdVar12[sVar20] =
               dVar37 / (pIVar16->num_weight).super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start[sVar20];
          auVar38._8_4_ = (int)((ulong)lVar24 >> 0x20);
          auVar38._0_8_ = lVar24;
          auVar38._12_4_ = 0x45300000;
          dVar37 = __tmp / ((auVar38._8_8_ - 1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)lVar24) - 4503599627370496.0));
LAB_0029ccbd:
          pdVar3[sVar20] = dVar37;
        }
      }
    }
    pvVar19 = (imputer->cat_sum).
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((imputer->cat_sum).
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != pvVar19) {
      piVar15 = input_data->ncat;
      sVar25 = input_data->ncols_categ;
      pdVar3 = (__range3_1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pIVar4 = (local_70->super__Vector_base<ImputeNode,_std::allocator<ImputeNode>_>)._M_impl.
               super__Vector_impl_data._M_start;
      for (sVar20 = 0; sVar20 != sVar25; sVar20 = sVar20 + 1) {
        pIVar16 = imputer;
        lVar24 = 2;
        if (dVar31 <= pdVar3[sVar20]) {
          pdVar5 = pvVar19[sVar20].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          for (pdVar17 = pvVar19[sVar20].super__Vector_base<double,_std::allocator<double>_>._M_impl
                         .super__Vector_impl_data._M_start; pdVar17 != pdVar5; pdVar17 = pdVar17 + 1
              ) {
            *pdVar17 = *pdVar17 / pdVar3[sVar20];
          }
        }
        else {
          while( true ) {
            sVar23 = pIVar16->parent;
            pIVar16 = pIVar4 + sVar23;
            lVar27 = *(long *)&pIVar4[sVar23].cat_weight.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl;
            if (0.0 < *(double *)(lVar27 + sVar20 * 8)) break;
            if (sVar23 == 0) goto LAB_0029ce05;
            lVar24 = lVar24 + 2;
          }
          auVar40._8_4_ = (int)((ulong)lVar24 >> 0x20);
          auVar40._0_8_ = lVar24;
          auVar40._12_4_ = 0x45300000;
          uVar11 = piVar15[sVar20];
          if (piVar15[sVar20] < 1) {
            uVar11 = 0;
          }
          for (uVar26 = 0; uVar11 != uVar26; uVar26 = uVar26 + 1) {
            dVar37 = *(double *)
                      (*(long *)&(pIVar16->cat_sum).
                                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[sVar20].
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data + uVar26 * 8);
            dVar41 = 0.0;
            if (0.0 < dVar37) {
              dVar41 = dVar37 / *(double *)(lVar27 + sVar20 * 8);
            }
            pdVar6 = pvVar19[sVar20].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar6[uVar26] = dVar41 + pdVar6[uVar26];
            pdVar3[sVar20] =
                 __tmp / ((auVar40._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)lVar24) - 4503599627370496.0));
          }
LAB_0029ce05:
          dVar37 = 0.0;
          for (pdVar17 = pvVar19[sVar20].super__Vector_base<double,_std::allocator<double>_>._M_impl
                         .super__Vector_impl_data._M_start;
              pdVar17 !=
              pvVar19[sVar20].super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish; pdVar17 = pdVar17 + 1) {
            dVar37 = dVar37 + *pdVar17;
          }
          pdVar3[sVar20] = dVar37;
        }
      }
    }
    WVar1 = local_68->weigh_imp_rows;
    if (WVar1 == Flat) {
      pdVar5 = (imputer->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pdVar17 = (imputer->num_weight).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start; pdVar17 != pdVar5;
          pdVar17 = pdVar17 + 1) {
        *pdVar17 = *pdVar17 / __tmp;
      }
      pdVar5 = (imputer->cat_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pdVar17 = (imputer->cat_weight).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start; pdVar17 != pdVar5;
          pdVar17 = pdVar17 + 1) {
        *pdVar17 = *pdVar17 / __tmp;
      }
    }
    else if (WVar1 == Inverse) {
      pdVar5 = (imputer->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pdVar17 = (imputer->num_weight).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start; pdVar17 != pdVar5;
          pdVar17 = pdVar17 + 1) {
        *pdVar17 = *pdVar17 / (SQRT(__tmp) * __tmp);
      }
      pdVar5 = (imputer->cat_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pdVar17 = (imputer->cat_weight).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start; pdVar17 != pdVar5;
          pdVar17 = pdVar17 + 1) {
        *pdVar17 = *pdVar17 / (SQRT(__tmp) * __tmp);
      }
    }
    lVar24 = local_78 + 1;
    auVar34._8_4_ = (int)((ulong)lVar24 >> 0x20);
    auVar34._0_8_ = lVar24;
    auVar34._12_4_ = 0x45300000;
    dVar31 = (auVar34._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar24) - 4503599627370496.0);
    if (local_68->depth_imp == Higher) {
      pdVar5 = (imputer->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pdVar17 = (imputer->num_weight).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start; pdVar17 != pdVar5;
          pdVar17 = pdVar17 + 1) {
        *pdVar17 = *pdVar17 * dVar31;
      }
      pdVar5 = (imputer->cat_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pdVar17 = (imputer->cat_weight).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start; pdVar17 != pdVar5;
          pdVar17 = pdVar17 + 1) {
        *pdVar17 = *pdVar17 * dVar31;
      }
    }
    else if (local_68->depth_imp == Lower) {
      pdVar5 = (imputer->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pdVar17 = (imputer->num_weight).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start; pdVar17 != pdVar5;
          pdVar17 = pdVar17 + 1) {
        *pdVar17 = *pdVar17 / dVar31;
      }
      pdVar5 = (imputer->cat_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pdVar17 = (imputer->cat_weight).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start; pdVar17 != pdVar5;
          pdVar17 = pdVar17 + 1) {
        *pdVar17 = *pdVar17 / dVar31;
      }
    }
    if ((WVar1 != Prop) || (local_68->depth_imp != Same)) {
      sVar25 = input_data->ncols_numeric;
      pdVar3 = (this->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      for (sVar20 = 0; sVar25 != sVar20; sVar20 = sVar20 + 1) {
        pdVar12[sVar20] = pdVar3[sVar20] * pdVar12[sVar20];
      }
      piVar15 = input_data->ncat;
      sVar25 = input_data->ncols_categ;
      for (sVar20 = 0; sVar20 != sVar25; sVar20 = sVar20 + 1) {
        pdVar12 = (__range3_1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        uVar11 = piVar15[sVar20];
        if (piVar15[sVar20] < 1) {
          uVar11 = 0;
        }
        for (uVar26 = 0; uVar11 != uVar26; uVar26 = uVar26 + 1) {
          pdVar3 = pvVar19[sVar20].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar3[uVar26] = pdVar12[sVar20] * pdVar3[uVar26];
        }
      }
    }
    return;
  }
  puVar2 = (workspace->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pdVar3 = (imputer->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pdVar12 = (imputer->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start; pdVar12 != pdVar3; pdVar12 = pdVar12 + 1) {
    *pdVar12 = __tmp;
  }
  local_60 = (robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
              *)&workspace->weights_map;
  uVar26 = 0;
LAB_0029c9bc:
  if (uVar26 < input_data->ncols_numeric) {
    lVar24 = input_data->Xc_indptr[uVar26];
    lVar27 = input_data->Xc_indptr[uVar26 + 1];
    local_a8 = (longdouble)CONCAT28(local_a8._8_2_,uVar26 + 1);
    uVar18 = input_data->Xc_ind[lVar27 + -1];
    key = std::__lower_bound<unsigned_long*,long,__gnu_cxx::__ops::_Iter_less_val>
                    (puVar2 + workspace->st,puVar2 + workspace->end + 1,input_data->Xc_ind + lVar24)
    ;
LAB_0029ca14:
    do {
      if (((key == puVar2 + workspace->end + 1) || (lVar24 == lVar27)) ||
         (uVar21 = *key, uVar18 < uVar21)) goto LAB_0029cb90;
      plVar13 = input_data->Xc_ind;
      if (plVar13[lVar24] == uVar21) {
        fVar35 = input_data->Xc[lVar24];
        pdVar12 = (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if ((workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish == pdVar12) {
          dVar31 = 1.0;
          if ((workspace->weights_map).m_ht.m_nb_elements != 0) {
            local_7c = fVar35;
            pVar42 = tsl::detail_robin_hash::
                     robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                     ::try_emplace<unsigned_long_const&>(local_60,key);
            puVar14 = (pVar42.first.m_bucket.m_bucket)->m_value + 8;
            fVar35 = local_7c;
            goto LAB_0029caec;
          }
        }
        else {
          puVar14 = (uchar *)(pdVar12 + uVar21);
LAB_0029caec:
          dVar31 = *(double *)puVar14;
        }
        if (ABS((double)fVar35) == INFINITY || NAN(fVar35)) {
          pdVar12 = (this->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          pdVar12[uVar26] = pdVar12[uVar26] - dVar31;
        }
        else {
          pdVar12 = (imputer->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pdVar12[uVar26] = dVar31 * (double)fVar35 + pdVar12[uVar26];
        }
        if ((key == puVar2 + workspace->end) || (lVar24 == lVar27 + -1)) goto LAB_0029cb90;
        key = key + 1;
        plVar13 = std::__lower_bound<long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                            (input_data->Xc_ind + lVar24,input_data->Xc_ind + lVar27,key);
      }
      else {
        if ((long)uVar21 < plVar13[lVar24]) {
          key = std::__lower_bound<unsigned_long*,long,__gnu_cxx::__ops::_Iter_less_val>();
          goto LAB_0029ca14;
        }
        plVar13 = std::__lower_bound<long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                            (plVar13 + lVar24 + 1,plVar13 + lVar27,key);
      }
      lVar24 = (long)plVar13 - (long)input_data->Xc_ind >> 3;
    } while( true );
  }
  goto LAB_0029cbba;
LAB_0029cb90:
  pdVar12 = (imputer->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  pdVar12[uVar26] =
       pdVar12[uVar26] /
       (imputer->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start[uVar26];
  uVar26 = local_a8._0_8_;
  goto LAB_0029c9bc;
}

Assistant:

void build_impute_node(ImputeNode &imputer,    WorkerMemory &workspace,
                       InputData  &input_data, ModelParams  &model_params,
                       std::vector<ImputeNode> &imputer_tree,
                       size_t curr_depth, size_t min_imp_obs)
{
    double wsum;
    bool has_weights = workspace.weights_arr.size() || workspace.weights_map.size();
    if (!has_weights)
        wsum = (double)(workspace.end - workspace.st + 1);
    else
        wsum = calculate_sum_weights<ldouble_safe>(
                                     workspace.ix_arr, workspace.st, workspace.end, curr_depth,
                                     workspace.weights_arr, workspace.weights_map);

    imputer.num_sum.resize(input_data.ncols_numeric, 0);
    imputer.num_weight.resize(input_data.ncols_numeric, 0);
    imputer.cat_sum.resize(input_data.ncols_categ);
    imputer.cat_weight.resize(input_data.ncols_categ, 0);
    imputer.num_sum.shrink_to_fit();
    imputer.num_weight.shrink_to_fit();
    imputer.cat_sum.shrink_to_fit();
    imputer.cat_weight.shrink_to_fit();

    /* Note: in theory, 'num_weight' could be initialized to 'wsum',
       and the entries could get subtracted the weight afterwards, but due to rounding
       error, this could produce some cases of no-present observations having positive
       weight, or cases of negative weight, so it's better to add it for each row after
       checking for possible NAs, even though it's less computationally efficient.
       For sparse matrices it's done the other way as otherwise it would be too slow. */

    for (size_t col = 0; col < input_data.ncols_categ; col++)
    {
        imputer.cat_sum[col].resize(input_data.ncat[col]);
        imputer.cat_sum[col].shrink_to_fit();
    }

    double  xnum;
    int     xcat;
    double  weight;
    size_t  ix;

    if ((input_data.Xc_indptr == NULL && input_data.ncols_numeric) || input_data.ncols_categ)
    {
        if (!has_weights)
        {
            size_t cnt;
            if (input_data.numeric_data != NULL)
            {
                for (size_t col = 0; col < input_data.ncols_numeric; col++)
                {
                    cnt = 0;
                    for (size_t row = workspace.st; row <= workspace.end; row++)
                    {
                        xnum = input_data.numeric_data[workspace.ix_arr[row] + col * input_data.nrows];
                        if (!is_na_or_inf(xnum))
                        {
                            cnt++;
                            imputer.num_sum[col] += (xnum - imputer.num_sum[col]) / (ldouble_safe)cnt;
                        }
                    }
                    imputer.num_weight[col] = (double) cnt;
                }
            }

            if (input_data.categ_data != NULL)
            {
                for (size_t col = 0; col < input_data.ncols_categ; col++)
                {
                    cnt = 0;
                    for (size_t row = workspace.st; row <= workspace.end; row++)
                    {
                        xcat = input_data.categ_data[workspace.ix_arr[row] + col * input_data.nrows];
                        if (xcat >= 0)
                        {
                            cnt++;
                            imputer.cat_sum[col][xcat]++; /* later gets divided */
                        }
                    }
                    imputer.cat_weight[col] = (double) cnt;
                }
            }

        }

        else
        {
            ldouble_safe prod_sum, corr, val, diff;
            if (input_data.numeric_data != NULL)
            {
                 for (size_t col = 0; col < input_data.ncols_numeric; col++)
                 {
                    prod_sum = 0; corr = 0;
                    for (size_t row = workspace.st; row <= workspace.end; row++)
                    {
                        xnum = input_data.numeric_data[workspace.ix_arr[row] + col * input_data.nrows];
                        if (!is_na_or_inf(xnum))
                        {
                            if (workspace.weights_arr.size())
                                weight = workspace.weights_arr[workspace.ix_arr[row]];
                            else
                                weight = workspace.weights_map[workspace.ix_arr[row]];

                            imputer.num_weight[col] += weight; /* these are always <= 1 */
                            val      =  (xnum * weight) - corr;
                            diff     =  prod_sum + val;
                            corr     =  (diff - prod_sum) - val;
                            prod_sum =  diff;
                        }
                    }
                    imputer.num_sum[col] = prod_sum / imputer.num_weight[col];
                 }
            }


            if (input_data.ncols_categ)
            {
                for (size_t row = workspace.st; row <= workspace.end; row++)
                {
                    ix = workspace.ix_arr[row];
                    if (workspace.weights_arr.size())
                        weight = workspace.weights_arr[ix];
                    else
                        weight = workspace.weights_map[ix];

                    for (size_t col = 0; col < input_data.ncols_categ; col++)
                    {
                        xcat = input_data.categ_data[ix + col * input_data.nrows];
                        if (xcat >= 0)
                        {
                            imputer.cat_sum[col][xcat] += weight; /* later gets divided */
                            imputer.cat_weight[col]    += weight;
                        }
                    }
                }
            }
        }
    }

    if (input_data.Xc_indptr != NULL) /* sparse numeric */
    {
        size_t *ix_arr = workspace.ix_arr.data();
        size_t st_col, end_col, ind_end_col, curr_pos;
        std::fill(imputer.num_weight.begin(), imputer.num_weight.end(), wsum);

        for (size_t col = 0; col < input_data.ncols_numeric; col++)
        {
            st_col      =  input_data.Xc_indptr[col];
            end_col     =  input_data.Xc_indptr[col + 1] - 1;
            ind_end_col =  input_data.Xc_ind[end_col];
            curr_pos    =  st_col;
            for (size_t *row = std::lower_bound(ix_arr + workspace.st, ix_arr + workspace.end + 1, input_data.Xc_ind[st_col]);
                 row != ix_arr + workspace.end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
                )
            {
                if (input_data.Xc_ind[curr_pos] == static_cast<typename std::remove_pointer<decltype(input_data.Xc_ind)>::type>(*row))
                {
                    xnum = input_data.Xc[curr_pos];
                    if (workspace.weights_arr.size())
                        weight = workspace.weights_arr[*row];
                    else if (workspace.weights_map.size())
                        weight = workspace.weights_map[*row];
                    else
                        weight = 1;

                    if (!is_na_or_inf(xnum))
                    {
                        imputer.num_sum[col]    += weight * xnum;
                    }

                    else
                    {
                        imputer.num_weight[col] -= weight;
                    }

                    if (row == ix_arr + workspace.end || curr_pos == end_col) break;
                    curr_pos = std::lower_bound(input_data.Xc_ind + curr_pos, input_data.Xc_ind + end_col + 1, *(++row)) - input_data.Xc_ind;
                }

                else
                {
                    if (input_data.Xc_ind[curr_pos] > static_cast<typename std::remove_pointer<decltype(input_data.Xc_ind)>::type>(*row))
                        row = std::lower_bound(row + 1, ix_arr + workspace.end + 1, input_data.Xc_ind[curr_pos]);
                    else
                        curr_pos = std::lower_bound(input_data.Xc_ind + curr_pos + 1, input_data.Xc_ind + end_col + 1, *row) - input_data.Xc_ind;
                }
            }

            imputer.num_sum[col] /= imputer.num_weight[col];
        }
    }

    /* if any value is not possible to impute, look it up from the parent tree, but assign a lesser weight
       Note: in theory, the parent node should always have some imputation value for every variable, but due to
       numeric rounding errors, it might have a weight of zero, so in those cases it's looked up higher up the
       tree instead. */
    size_t look_aboves, curr_tree;
    double min_imp_obs_dbl = (double) min_imp_obs;
    if (imputer.num_sum.size())
    {
        for (size_t col = 0; col < input_data.ncols_numeric; col++)
        {
            if (imputer.num_weight[col] < min_imp_obs_dbl)
            {
                look_aboves = 1;
                curr_tree   = imputer.parent;
                while (true)
                {
                    if (!is_na_or_inf(imputer_tree[curr_tree].num_sum[col]))
                    {
                        imputer.num_sum[col]     =  imputer_tree[curr_tree].num_sum[col] / imputer_tree[curr_tree].num_weight[col];
                        imputer.num_weight[col]  =  wsum / (double)(2 * look_aboves);
                        break;
                    }

                    else if (curr_tree > 0)
                    {
                        curr_tree = imputer_tree[curr_tree].parent;
                        look_aboves++;
                    }

                    else /* will only happen if every single value is missing */
                    {
                        imputer.num_sum[col]    = NAN;
                        imputer.num_weight[col] = 0;
                        break;
                    }
                }
            }
        }
    }

    if (imputer.cat_sum.size())
    {
        for (size_t col = 0; col < input_data.ncols_categ; col++)
        {
            if (imputer.cat_weight[col] >= min_imp_obs_dbl)
            {
                for (double &cat : imputer.cat_sum[col])
                    cat /= imputer.cat_weight[col];
            }

            else
            {
                look_aboves = 1;
                curr_tree   = imputer.parent;
                while (true)
                {
                    if (imputer_tree[curr_tree].cat_weight[col] > 0)
                    {
                        for (int cat = 0; cat < input_data.ncat[col]; cat++)
                        {
                            imputer.cat_sum[col][cat]
                                +=
                            (imputer_tree[curr_tree].cat_sum[col][cat] > 0)?
                                (imputer_tree[curr_tree].cat_sum[col][cat] / imputer_tree[curr_tree].cat_weight[col]) : 0.;
                            imputer.cat_weight[col]    =  wsum / (double)(2 * look_aboves);
                        }
                        break;
                    }

                    else if (curr_tree > 0)
                    {
                        curr_tree = imputer_tree[curr_tree].parent;
                        look_aboves++;
                    }

                    else /* will only happen if every single value is missing */
                    {
                        break;
                    }
                }
                imputer.cat_weight[col] = std::accumulate(imputer.cat_sum[col].begin(),
                                                          imputer.cat_sum[col].end(),
                                                          (double) 0);
            }
        }
    }

    /* re-adjust the weights according to parameters
       (note that by this point, the weights are a sum) */
    switch(model_params.weigh_imp_rows)
    {
        case Inverse:
        {
            double wsum_div = wsum * std::sqrt(wsum);
            for (double &w : imputer.num_weight)
                w /= wsum_div;

            for (double &w : imputer.cat_weight)
                w /= wsum_div;
            break;
        }

        case Flat:
        {
            for (double &w : imputer.num_weight)
                w /= wsum;
            for (double &w : imputer.cat_weight)
                w /= wsum;
            break;
        }

        default: {}

        /* TODO: maybe divide by nrows for prop */
    }

    double curr_depth_dbl = (double) (curr_depth + 1);
    switch(model_params.depth_imp)
    {
        case Lower:
        {
            for (double &w : imputer.num_weight)
                w /= curr_depth_dbl;
            for (double &w : imputer.cat_weight)
                w /= curr_depth_dbl;
            break;
        }

        case Higher:
        {
            for (double &w : imputer.num_weight)
                w *= curr_depth_dbl;
            for (double &w : imputer.cat_weight)
                w *= curr_depth_dbl;
            break;
        }

        default: {}
    }

    /* now re-adjust sums */
    if (model_params.weigh_imp_rows != Prop || model_params.depth_imp != Same)
    {
        for (size_t col = 0; col < input_data.ncols_numeric; col++)
            imputer.num_sum[col] *= imputer.num_weight[col];

        for (size_t col = 0; col < input_data.ncols_categ; col++)
            for (int cat = 0; cat < input_data.ncat[col]; cat++)
                imputer.cat_sum[col][cat] *= imputer.cat_weight[col];
    }
}